

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

bool anon_unknown.dwarf_11b41ac::isUnionMemberType(Type *left,Type *right)

{
  Type *rhs;
  bool bVar1;
  Scope *this;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar2;
  Type *pTVar3;
  bool bVar4;
  FieldSymbol *field;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar5;
  
  if (left->canonical == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(left);
  }
  pTVar3 = left->canonical;
  if (right->canonical == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(right);
  }
  rhs = right->canonical;
  if (pTVar3->canonical == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(pTVar3);
  }
  if ((pTVar3->canonical->super_Symbol).kind == PackedUnionType) {
    this = slang::ast::Symbol::scopeOrNull(&pTVar3->super_Symbol);
    sVar5 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(this);
    sVar2 = sVar5._M_begin.current;
joined_r0x00383a60:
    bVar4 = sVar2.current != sVar5._M_end.current.current;
    if (bVar4) {
      pTVar3 = slang::ast::DeclaredType::getType((DeclaredType *)(sVar2.current + 1));
      bVar1 = slang::ast::Type::isMatching(pTVar3,rhs);
      if (bVar1) {
        return bVar4;
      }
      bVar1 = isUnionMemberType(pTVar3,rhs);
      if (bVar1) {
        return bVar4;
      }
      do {
        sVar2.current = (sVar2.current)->nextInScope;
        if (sVar2.current == (Symbol *)0x0) break;
      } while ((sVar2.current)->kind != Field);
      goto joined_r0x00383a60;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isUnionMemberType(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (!lt.isPackedUnion())
        return false;

    for (auto& field : lt.as<Scope>().membersOfType<FieldSymbol>()) {
        auto& ft = field.getType();
        if (ft.isMatching(rt) || isUnionMemberType(ft, rt))
            return true;
    }
    return false;
}